

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

object * __thiscall jessilib::object::operator[](object *this,index_type in_index)

{
  bool bVar1;
  add_pointer_t<std::vector<jessilib::object>_> this_00;
  size_type sVar2;
  long lVar3;
  add_pointer_t<std::vector<jessilib::object>_> array_ptr;
  index_type in_index_local;
  object *this_local;
  
  bVar1 = null(this);
  if (bVar1) {
    std::
    variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
    ::emplace<std::vector<jessilib::object,std::allocator<jessilib::object>>>
              ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
                *)this);
  }
  this_00 = std::
            get_if<std::vector<jessilib::object,std::allocator<jessilib::object>>,void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
                      (&this->m_value);
  if (this_00 == (add_pointer_t<std::vector<jessilib::object>_>)0x0) {
    lVar3 = __tls_get_addr(&PTR_00311c58);
    if (*(char *)(lVar3 + 0xb0) == '\0') {
      lVar3 = __tls_get_addr(&PTR_00311c58);
      __cxa_thread_atexit(~object,lVar3 + 0x70,&__dso_handle);
      lVar3 = __tls_get_addr(&PTR_00311c58);
      *(undefined1 *)(lVar3 + 0xb0) = 1;
    }
    lVar3 = __tls_get_addr(&PTR_00311c58);
    std::
    variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
    ::emplace<void*>((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
                      *)(lVar3 + 0x70));
    lVar3 = __tls_get_addr(&PTR_00311c58);
    this_local = (object *)(lVar3 + 0x70);
  }
  else {
    while (sVar2 = std::vector<jessilib::object,_std::allocator<jessilib::object>_>::size(this_00),
          sVar2 <= in_index) {
      std::vector<jessilib::object,_std::allocator<jessilib::object>_>::emplace_back<>(this_00);
    }
    this_local = std::vector<jessilib::object,_std::allocator<jessilib::object>_>::at
                           (this_00,in_index);
  }
  return this_local;
}

Assistant:

object& object::operator[](index_type in_index) {
	if (null()) {
		m_value.emplace<array_type>();
	}

	auto array_ptr = std::get_if<array_type>(&m_value);
	if (array_ptr != nullptr) {
		while (array_ptr->size() <= in_index) {
			array_ptr->emplace_back();
		}

		return array_ptr->at(in_index);
	}

	static thread_local object s_null_object;
	s_null_object.m_value.emplace<null_variant_t>();
	return s_null_object;
}